

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::Tokenizer::parse_tokens
          (Tokenizer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *features,vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_map)

{
  bool bVar1;
  Casing CVar2;
  size_type sVar3;
  ulong uVar4;
  runtime_error *this_00;
  const_reference pvVar5;
  const_reference pvVar6;
  char *pcVar7;
  Token *pTVar8;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_RDI;
  size_type in_R8;
  size_t j;
  Token token;
  CaseMarkupType case_markup;
  size_t features_offset;
  size_t i;
  Casing case_modifier;
  Casing case_region;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  Token *in_stack_ffffffffffffff08;
  Casing in_stack_ffffffffffffff10;
  CaseMarkupType in_stack_ffffffffffffff14;
  size_type in_stack_ffffffffffffff28;
  string local_c0 [32];
  Token *in_stack_ffffffffffffff60;
  Tokenizer *in_stack_ffffffffffffff68;
  Token *local_40;
  ulong local_38;
  Casing local_30;
  Casing local_2c;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(in_RSI);
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::reserve(in_RDI,in_stack_ffffffffffffff28);
  if (in_R8 != 0) {
    sVar3 = in_R8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(in_RSI);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,sVar3);
  }
  local_2c = None;
  local_30 = None;
  local_38 = 0;
  do {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RSI);
    if (sVar3 <= local_38) {
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RSI,local_38);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_40 = (Token *)0x0;
      if (((ulong)in_RDI[2].super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
                  super__Vector_impl_data._M_start & 0x100) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RSI,local_38);
        in_stack_ffffffffffffff14 = read_case_markup(in_stack_fffffffffffffef8);
        if (in_stack_ffffffffffffff14 == Modifier) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](in_RSI,local_38);
          local_30 = get_casing_from_markup
                               ((string *)
                                CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        }
        else if (in_stack_ffffffffffffff14 == RegionBegin) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](in_RSI,local_38);
          local_2c = get_casing_from_markup
                               ((string *)
                                CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
          local_30 = None;
        }
        else {
          if (in_stack_ffffffffffffff14 != RegionEnd) {
            in_stack_ffffffffffffff10 = local_2c;
            CVar2 = local_2c;
            if (local_30 != None) {
              in_stack_ffffffffffffff10 = local_30;
              CVar2 = local_30;
            }
            goto LAB_003c3766;
          }
          local_2c = None;
          local_30 = None;
        }
      }
      else {
        bVar1 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::empty((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        if (bVar1) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Missing case feature");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar5 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](in_RDX,0);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar5,local_38);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar6);
        CVar2 = char_to_casing(*pcVar7);
        local_40 = (Token *)0x1;
LAB_003c3766:
        local_30 = CVar2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RSI,local_38);
        annotate_token(in_stack_ffffffffffffff68,&in_stack_ffffffffffffff60->surface);
        bVar1 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::empty((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        pTVar8 = local_40;
        if (!bVar1) {
          while (in_stack_ffffffffffffff08 = pTVar8,
                in_stack_ffffffffffffff60 = in_stack_ffffffffffffff08,
                pTVar8 = (Token *)std::
                                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ::size(in_RDX), in_stack_ffffffffffffff08 < pTVar8) {
            pvVar5 = std::
                     vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](in_RDX,(size_type)in_stack_ffffffffffffff60);
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](pvVar5,local_38);
            std::__cxx11::string::string(local_c0,(string *)pvVar6);
            Token::append_feature
                      ((Token *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffef8);
            std::__cxx11::string::~string(local_c0);
            pTVar8 = (Token *)&(in_stack_ffffffffffffff60->surface).field_0x1;
          }
        }
        in_stack_ffffffffffffff07 = Token::empty((Token *)0x3c388c);
        if (!(bool)in_stack_ffffffffffffff07) {
          local_30 = None;
        }
        std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                  ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        if (in_R8 != 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (value_type_conflict2 *)in_stack_ffffffffffffff08);
        }
        Token::~Token((Token *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void Tokenizer::parse_tokens(const std::vector<std::string>& words,
                               const std::vector<std::vector<std::string>>& features,
                               std::vector<Token>& tokens,
                               std::vector<size_t>* index_map) const
  {
    tokens.reserve(words.size());
    if (index_map)
      index_map->reserve(words.size());
    Casing case_region = Casing::None;
    Casing case_modifier = Casing::None;

    for (size_t i = 0; i < words.size(); ++i)
    {
      if (words[i].empty())
        continue;

      size_t features_offset = 0;
      if (_options.case_feature)
      {
        if (features.empty())
          throw std::runtime_error("Missing case feature");
        case_modifier = char_to_casing(features[0][i][0]);
        features_offset = 1;
      }
      else
      {
        auto case_markup = read_case_markup(words[i]);
        switch (case_markup)
        {
        case CaseMarkupType::RegionBegin:
          case_region = get_casing_from_markup(words[i]);
          case_modifier = Casing::None;
          continue;
        case CaseMarkupType::RegionEnd:
          case_region = Casing::None;
          case_modifier = Casing::None;
          continue;
        case CaseMarkupType::Modifier:
          case_modifier = get_casing_from_markup(words[i]);
          continue;
        default:
          case_modifier = (case_modifier != Casing::None ? case_modifier : case_region);
          break;
        }
      }

      Token token = annotate_token(words[i]);
      token.casing = case_modifier;
      if (!features.empty())
      {
        for (size_t j = features_offset; j < features.size(); ++j)
          token.append_feature(features[j][i]);
      }
      // Forward the case modifier if the current token is a joiner or spacer.
      if (!token.empty())
        case_modifier = Casing::None;

      tokens.emplace_back(std::move(token));
      if (index_map)
        index_map->push_back(i);
    }
  }